

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_ptr_test.cpp
# Opt level: O1

void __thiscall
unique_ptr_basic_ptr_Test::~unique_ptr_basic_ptr_Test(unique_ptr_basic_ptr_Test *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  testing::Test::~Test(&this->super_Test);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x10);
    return;
  }
  __stack_chk_fail();
}

Assistant:

TEST(unique_ptr, basic_ptr)
{
    {
        // Create a unique_ptr
        unique_ptr<Struct2> xPtr(new Struct2(123));

        EXPECT_EQ(true, xPtr);
        EXPECT_NE((void*)NULL, xPtr.get());

        if (xPtr)
        {
            EXPECT_EQ(123,  xPtr->mVal);
            EXPECT_EQ(1,    xPtr->_mNbInstances);
            EXPECT_EQ(1,    Struct2::_mNbInstances);

            // call a function
            xPtr->incr();
            EXPECT_EQ(124,  xPtr->mVal);
            (*xPtr).incr();
            EXPECT_EQ(125,  (*xPtr).mVal);
            xPtr->decr();
            xPtr->decr();

            // Copy construct the unique_ptr, transferring ownership
            unique_ptr<Struct2> yPtr(xPtr);

            EXPECT_NE(xPtr,  yPtr);
            EXPECT_EQ(false, xPtr);
            EXPECT_EQ((void*)NULL,  xPtr.get());
            EXPECT_EQ(true,  yPtr);
            EXPECT_NE((void*)NULL,  yPtr.get());
            EXPECT_EQ(123,   yPtr->mVal);
            EXPECT_EQ(1,     Struct2::_mNbInstances);

            if (yPtr)
            {
                unique_ptr<Struct2> zPtr;
                // Assign the unique_ptr, transferring ownership
                zPtr = yPtr;

                EXPECT_NE(yPtr,  zPtr);
                EXPECT_EQ(false, yPtr);
                EXPECT_EQ((void*)NULL, yPtr.get());
                EXPECT_EQ(true,  zPtr);
                EXPECT_NE((void*)NULL,  zPtr.get());
                EXPECT_EQ(123,   zPtr->mVal);
                EXPECT_EQ(1,     Struct2::_mNbInstances);
            }

            EXPECT_EQ(false, xPtr);
            EXPECT_EQ((void*)NULL, xPtr.get());
            EXPECT_EQ(false, yPtr);
            EXPECT_EQ((void*)NULL, yPtr.get());
            EXPECT_EQ(0, Struct2::_mNbInstances);
        }
        else
        {
            GTEST_FATAL_FAILURE_("bool cast operator error");
        }

        EXPECT_EQ(false, xPtr);
        EXPECT_EQ((void*)NULL, xPtr.get());
        EXPECT_EQ(0, Struct2::_mNbInstances);
    }

    EXPECT_EQ(0,     Struct2::_mNbInstances);
}